

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred.c
# Opt level: O2

void uavs3d_if_hor_ver_luma
               (pel *src,int i_src,pel *dst,int i_dst,int width,int height,s8 *coeff_h,s8 *coeff_v,
               int max_val)

{
  ulong uVar1;
  ulong uVar2;
  char cVar3;
  long lVar4;
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  long lVar7;
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  unkuint9 Var21;
  undefined1 auVar22 [11];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  int iVar28;
  long lVar29;
  sbyte sVar30;
  long lVar31;
  ulong uVar32;
  int iVar33;
  undefined1 *puVar34;
  undefined1 *puVar35;
  undefined1 *puVar36;
  ulong uVar37;
  undefined1 *puVar38;
  undefined1 *puVar39;
  undefined1 *puVar40;
  pel *ppVar41;
  undefined1 *puVar42;
  undefined1 *puVar43;
  undefined1 auVar44 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar60 [16];
  pel *local_8760;
  undefined1 local_8738 [34568];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 uVar61;
  
  sVar30 = (max_val != 0xff) * '\x02';
  cVar3 = (max_val == 0xff) * '\x02';
  ppVar41 = src + i_src * -3;
  uVar32 = 0;
  if (0 < width) {
    uVar32 = (ulong)(uint)width;
  }
  lVar29 = (long)width;
  if (max_val == 0xff) {
    puVar35 = local_8738;
    for (iVar33 = -3; iVar33 < height + 4; iVar33 = iVar33 + 1) {
      for (uVar37 = 0; uVar32 != uVar37; uVar37 = uVar37 + 1) {
        uVar1 = *(ulong *)(ppVar41 + (uVar37 - 3));
        auVar5._8_6_ = 0;
        auVar5._0_8_ = uVar1;
        auVar5[0xe] = (char)(uVar1 >> 0x38);
        auVar8._8_4_ = 0;
        auVar8._0_8_ = uVar1;
        auVar8[0xc] = (char)(uVar1 >> 0x30);
        auVar8._13_2_ = auVar5._13_2_;
        auVar10._8_4_ = 0;
        auVar10._0_8_ = uVar1;
        auVar10._12_3_ = auVar8._12_3_;
        auVar12._8_2_ = 0;
        auVar12._0_8_ = uVar1;
        auVar12[10] = (char)(uVar1 >> 0x28);
        auVar12._11_4_ = auVar10._11_4_;
        auVar14._8_2_ = 0;
        auVar14._0_8_ = uVar1;
        auVar14._10_5_ = auVar12._10_5_;
        auVar16[8] = (char)(uVar1 >> 0x20);
        auVar16._0_8_ = uVar1;
        auVar16._9_6_ = auVar14._9_6_;
        auVar20._7_8_ = 0;
        auVar20._0_7_ = auVar16._8_7_;
        Var21 = CONCAT81(SUB158(auVar20 << 0x40,7),(char)(uVar1 >> 0x18));
        auVar24._9_6_ = 0;
        auVar24._0_9_ = Var21;
        auVar22._1_10_ = SUB1510(auVar24 << 0x30,5);
        auVar22[0] = (char)(uVar1 >> 0x10);
        auVar25._11_4_ = 0;
        auVar25._0_11_ = auVar22;
        auVar18[2] = (char)(uVar1 >> 8);
        auVar18._0_2_ = (ushort)uVar1;
        auVar18._3_12_ = SUB1512(auVar25 << 0x20,3);
        uVar2 = *(ulong *)coeff_h;
        uVar61 = (undefined1)(uVar2 >> 0x38);
        auVar51._8_6_ = 0;
        auVar51._0_8_ = uVar2;
        auVar51[0xe] = uVar61;
        auVar51[0xf] = uVar61;
        uVar61 = (undefined1)(uVar2 >> 0x30);
        auVar50._14_2_ = auVar51._14_2_;
        auVar50._8_5_ = 0;
        auVar50._0_8_ = uVar2;
        auVar50[0xd] = uVar61;
        auVar49._13_3_ = auVar50._13_3_;
        auVar49._8_4_ = 0;
        auVar49._0_8_ = uVar2;
        auVar49[0xc] = uVar61;
        uVar61 = (undefined1)(uVar2 >> 0x28);
        auVar48._12_4_ = auVar49._12_4_;
        auVar48._8_3_ = 0;
        auVar48._0_8_ = uVar2;
        auVar48[0xb] = uVar61;
        auVar47._11_5_ = auVar48._11_5_;
        auVar47._8_2_ = 0;
        auVar47._0_8_ = uVar2;
        auVar47[10] = uVar61;
        uVar61 = (undefined1)(uVar2 >> 0x20);
        auVar46._10_6_ = auVar47._10_6_;
        auVar46[8] = 0;
        auVar46._0_8_ = uVar2;
        auVar46[9] = uVar61;
        auVar45._9_7_ = auVar46._9_7_;
        auVar45[8] = uVar61;
        auVar45._0_8_ = uVar2;
        uVar61 = (undefined1)(uVar2 >> 0x18);
        auVar44._8_8_ = auVar45._8_8_;
        auVar44[7] = uVar61;
        auVar44[6] = uVar61;
        uVar61 = (undefined1)(uVar2 >> 0x10);
        auVar44[5] = uVar61;
        auVar44[4] = uVar61;
        uVar61 = (undefined1)(uVar2 >> 8);
        auVar44[3] = uVar61;
        auVar44[2] = uVar61;
        auVar44[0] = (undefined1)uVar2;
        auVar44[1] = auVar44[0];
        auVar52 = psraw(auVar44,8);
        *(ushort *)(puVar35 + uVar37 * 2) =
             auVar52._14_2_ * (auVar5._13_2_ >> 8) + auVar52._6_2_ * (short)Var21 +
             auVar52._10_2_ * auVar12._10_2_ + auVar52._2_2_ * auVar18._2_2_ +
             auVar52._12_2_ * auVar8._12_2_ + auVar52._4_2_ * auVar22._0_2_ +
             auVar52._8_2_ * auVar16._8_2_ + auVar52._0_2_ * ((ushort)uVar1 & 0xff);
      }
      ppVar41 = ppVar41 + i_src;
      puVar35 = puVar35 + lVar29 * 2;
    }
  }
  else {
    puVar35 = local_8738;
    for (iVar33 = -3; iVar33 < height + 4; iVar33 = iVar33 + 1) {
      for (uVar37 = 0; uVar32 != uVar37; uVar37 = uVar37 + 1) {
        uVar1 = *(ulong *)(ppVar41 + (uVar37 - 3));
        auVar6._8_6_ = 0;
        auVar6._0_8_ = uVar1;
        auVar6[0xe] = (char)(uVar1 >> 0x38);
        auVar9._8_4_ = 0;
        auVar9._0_8_ = uVar1;
        auVar9[0xc] = (char)(uVar1 >> 0x30);
        auVar9._13_2_ = auVar6._13_2_;
        auVar11._8_4_ = 0;
        auVar11._0_8_ = uVar1;
        auVar11._12_3_ = auVar9._12_3_;
        auVar13._8_2_ = 0;
        auVar13._0_8_ = uVar1;
        auVar13[10] = (char)(uVar1 >> 0x28);
        auVar13._11_4_ = auVar11._11_4_;
        auVar15._8_2_ = 0;
        auVar15._0_8_ = uVar1;
        auVar15._10_5_ = auVar13._10_5_;
        auVar17[8] = (char)(uVar1 >> 0x20);
        auVar17._0_8_ = uVar1;
        auVar17._9_6_ = auVar15._9_6_;
        auVar23._7_8_ = 0;
        auVar23._0_7_ = auVar17._8_7_;
        auVar26._1_8_ = SUB158(auVar23 << 0x40,7);
        auVar26[0] = (char)(uVar1 >> 0x18);
        auVar26._9_6_ = 0;
        auVar27._1_10_ = SUB1510(auVar26 << 0x30,5);
        auVar27[0] = (char)(uVar1 >> 0x10);
        auVar27._11_4_ = 0;
        auVar19[2] = (char)(uVar1 >> 8);
        auVar19._0_2_ = (ushort)uVar1;
        auVar19._3_12_ = SUB1512(auVar27 << 0x20,3);
        auVar52._0_2_ = (ushort)uVar1 & 0xff;
        auVar52._2_13_ = auVar19._2_13_;
        auVar52[0xf] = 0;
        uVar1 = *(ulong *)coeff_h;
        uVar61 = (undefined1)(uVar1 >> 0x38);
        auVar60._8_6_ = 0;
        auVar60._0_8_ = uVar1;
        auVar60[0xe] = uVar61;
        auVar60[0xf] = uVar61;
        uVar61 = (undefined1)(uVar1 >> 0x30);
        auVar59._14_2_ = auVar60._14_2_;
        auVar59._8_5_ = 0;
        auVar59._0_8_ = uVar1;
        auVar59[0xd] = uVar61;
        auVar58._13_3_ = auVar59._13_3_;
        auVar58._8_4_ = 0;
        auVar58._0_8_ = uVar1;
        auVar58[0xc] = uVar61;
        uVar61 = (undefined1)(uVar1 >> 0x28);
        auVar57._12_4_ = auVar58._12_4_;
        auVar57._8_3_ = 0;
        auVar57._0_8_ = uVar1;
        auVar57[0xb] = uVar61;
        auVar56._11_5_ = auVar57._11_5_;
        auVar56._8_2_ = 0;
        auVar56._0_8_ = uVar1;
        auVar56[10] = uVar61;
        uVar61 = (undefined1)(uVar1 >> 0x20);
        auVar55._10_6_ = auVar56._10_6_;
        auVar55[8] = 0;
        auVar55._0_8_ = uVar1;
        auVar55[9] = uVar61;
        auVar54._9_7_ = auVar55._9_7_;
        auVar54[8] = uVar61;
        auVar54._0_8_ = uVar1;
        uVar61 = (undefined1)(uVar1 >> 0x18);
        auVar53._8_8_ = auVar54._8_8_;
        auVar53[7] = uVar61;
        auVar53[6] = uVar61;
        uVar61 = (undefined1)(uVar1 >> 0x10);
        auVar53[5] = uVar61;
        auVar53[4] = uVar61;
        uVar61 = (undefined1)(uVar1 >> 8);
        auVar53[3] = uVar61;
        auVar53[2] = uVar61;
        auVar53[0] = (undefined1)uVar1;
        auVar53[1] = auVar53[0];
        auVar60 = psraw(auVar53,8);
        auVar52 = pmaddwd(auVar60,auVar52);
        *(short *)(puVar35 + uVar37 * 2) =
             (short)((int)(auVar52._12_4_ + auVar52._4_4_ + auVar52._8_4_ + auVar52._0_4_ +
                          ((uint)(1 << sVar30) >> 1)) >> sVar30);
      }
      ppVar41 = ppVar41 + i_src;
      puVar35 = puVar35 + lVar29 * 2;
    }
  }
  lVar31 = (long)(width * 3);
  puVar35 = local_8738 + lVar31 * 2;
  if (height < 1) {
    height = 0;
  }
  lVar7 = lVar29 * 2;
  lVar4 = lVar31 * 2;
  puVar43 = local_8738 + lVar4 + (long)(width * 2) * -2;
  puVar39 = local_8738 + lVar4 + lVar29 * -2;
  puVar40 = local_8738 + lVar4 + lVar29 * 2;
  puVar36 = local_8738 + (long)(width * 2) * 2 + lVar31 * 2;
  puVar34 = local_8738 + lVar31 * 4;
  puVar38 = local_8738 + lVar4 + (long)(width * 4) * 2;
  puVar42 = local_8738;
  local_8760 = dst;
  for (iVar33 = 0; iVar33 != height; iVar33 = iVar33 + 1) {
    for (uVar37 = 0; uVar32 != uVar37; uVar37 = uVar37 + 1) {
      iVar28 = (int)coeff_v[7] * (int)*(short *)(puVar38 + uVar37 * 2) +
               (int)coeff_v[6] * (int)*(short *)(puVar34 + uVar37 * 2) +
               (int)coeff_v[5] * (int)*(short *)(puVar36 + uVar37 * 2) +
               (int)coeff_v[4] * (int)*(short *)(puVar40 + uVar37 * 2) +
               (int)coeff_v[3] * (int)*(short *)(puVar35 + uVar37 * 2) +
               (int)coeff_v[2] * (int)*(short *)(puVar39 + uVar37 * 2) +
               (int)coeff_v[1] * (int)*(short *)(puVar43 + uVar37 * 2) +
               (int)*coeff_v * (int)*(short *)(puVar42 + uVar37 * 2) + (1 << cVar3 + 9) >>
               cVar3 + 10;
      if (max_val <= iVar28) {
        iVar28 = max_val;
      }
      if (iVar28 < 1) {
        iVar28 = 0;
      }
      local_8760[uVar37] = (pel)iVar28;
    }
    local_8760 = local_8760 + i_dst;
    puVar35 = puVar35 + lVar7;
    puVar42 = puVar42 + lVar7;
    puVar43 = puVar43 + lVar7;
    puVar39 = puVar39 + lVar7;
    puVar40 = puVar40 + lVar7;
    puVar36 = puVar36 + lVar7;
    puVar34 = puVar34 + lVar7;
    puVar38 = puVar38 + lVar7;
  }
  return;
}

Assistant:

static void uavs3d_if_hor_ver_luma(const pel *src, int i_src, pel *dst, int i_dst, int width, int height, const s8 *coeff_h, const s8 *coeff_v, int max_val)
{
    int row, col;
    int sum, val;
    int add1, shift1;
    int add2, shift2;

    ALIGNED_16(s16 tmp_res[(128 + 7) * 128]);
    s16 *tmp;

    if (max_val == 255) { // 8 bit_depth
        shift1 = 0;
        shift2 = 12;
    }
    else { // 10 bit_depth
        shift1 = 2;
        shift2 = 10;
    }

    add1 = (1 << (shift1)) >> 1;
    add2 = 1 << (shift2 - 1);

    src += -3 * i_src;
    tmp = tmp_res;

    if (shift1) {
        for (row = -3; row < height + 4; row++) {
            for (col = 0; col < width; col++) {
                sum = FLT_8TAP_HOR(src, col, coeff_h);
                tmp[col] = (sum + add1) >> shift1;
            }
            src += i_src;
            tmp += width;
        }
    }
    else {
        for (row = -3; row < height + 4; row++) {
            for (col = 0; col < width; col++) {
                tmp[col] = FLT_8TAP_HOR(src, col, coeff_h);
            }
            src += i_src;
            tmp += width;
        }
    }

    tmp = tmp_res + 3 * width;

    for (row = 0; row < height; row++) {
        for (col = 0; col < width; col++) {
            sum = FLT_8TAP_VER(tmp, col, width, coeff_v);
            val = (sum + add2) >> shift2;
            dst[col] = COM_CLIP3(0, max_val, val);
        }
        dst += i_dst;
        tmp += width;
    }
}